

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O1

NodeRecord * __thiscall
embree::avx::CreateMortonLeaf<8,_embree::TriangleMi<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<8,_embree::TriangleMi<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  FastAllocator *this_00;
  ThreadLocal *pTVar10;
  ThreadLocal2 *this_01;
  iterator __position;
  TriangleMesh *pTVar11;
  BuildPrim *pBVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  undefined1 auVar16 [16];
  ulong uVar17;
  ulong uVar18;
  size_t i;
  ulong uVar19;
  uint uVar20;
  size_t sVar21;
  long lVar22;
  long lVar23;
  size_t __n;
  uint uVar24;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  vuint4 v0;
  vuint4 vgeomID;
  vuint4 v1;
  vuint4 v2;
  vuint4 vprimID;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  NodeRecord *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 (*local_60) [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_48;
  
  uVar4 = current->_begin;
  this_00 = alloc->alloc;
  pTVar10 = alloc->talloc1;
  local_b8._8_8_ = local_b8._0_8_;
  local_b8._0_8_ = 0x50;
  this_01 = pTVar10->parent;
  uVar20 = current->_end;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_90 = (NodeRecord *)CONCAT44(local_90._4_4_,current->_end);
    local_a8[8] = 1;
    local_a8._0_8_ = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_88._0_8_ = this_01;
    local_c8[8] = 1;
    local_c8._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)local_88);
    }
    else {
      *__position._M_current = (ThreadLocal2 *)local_88._0_8_;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (local_c8[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_c8._0_8_);
    }
    if (local_a8[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_a8._0_8_);
    }
    uVar20 = (uint)local_90;
  }
  uVar19 = (ulong)(uVar20 - uVar4);
  pTVar10->bytesUsed = pTVar10->bytesUsed + local_b8._0_8_;
  sVar21 = pTVar10->cur;
  uVar18 = (ulong)(-(int)sVar21 & 0xf);
  uVar17 = sVar21 + local_b8._0_8_ + uVar18;
  pTVar10->cur = uVar17;
  local_90 = __return_storage_ptr__;
  if (pTVar10->end < uVar17) {
    pTVar10->cur = sVar21;
    if (pTVar10->allocBlockSize < (ulong)(local_b8._0_8_ << 2)) {
      local_60 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)local_b8);
    }
    else {
      local_c8._0_8_ = pTVar10->allocBlockSize;
      local_60 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)local_c8);
      pTVar10->ptr = (char *)local_60;
      sVar21 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
      pTVar10->bytesWasted = sVar21;
      pTVar10->cur = 0;
      pTVar10->end = local_c8._0_8_;
      pTVar10->cur = local_b8._0_8_;
      if ((ulong)local_c8._0_8_ < (ulong)local_b8._0_8_) {
        pTVar10->cur = 0;
        local_c8._0_8_ = pTVar10->allocBlockSize;
        local_60 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)local_c8);
        pTVar10->ptr = (char *)local_60;
        sVar21 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
        pTVar10->bytesWasted = sVar21;
        pTVar10->cur = 0;
        pTVar10->end = local_c8._0_8_;
        pTVar10->cur = local_b8._0_8_;
        if ((ulong)local_c8._0_8_ < (ulong)local_b8._0_8_) {
          pTVar10->cur = 0;
          local_60 = (undefined1 (*) [16])0x0;
        }
        else {
          pTVar10->bytesWasted = sVar21;
        }
      }
      else {
        pTVar10->bytesWasted = sVar21;
      }
    }
  }
  else {
    pTVar10->bytesWasted = pTVar10->bytesWasted + uVar18;
    local_60 = (undefined1 (*) [16])(pTVar10->ptr + (uVar17 - local_b8._0_8_));
  }
  local_c8 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_b8 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
  local_78 = local_b8;
  if (uVar20 == uVar4) {
    local_58.m128[2] = INFINITY;
    local_58._0_8_ = 0x7f8000007f800000;
    local_58.m128[3] = INFINITY;
    local_48.m128[2] = -INFINITY;
    local_48._0_8_ = 0xff800000ff800000;
    local_48.m128[3] = -INFINITY;
  }
  else {
    pTVar11 = this->mesh;
    pBVar12 = this->morton;
    lVar13 = *(long *)&(pTVar11->super_Geometry).field_0x58;
    lVar14 = *(long *)&pTVar11->field_0x68;
    pcVar15 = (pTVar11->vertices0).super_RawBufferView.ptr_ofs;
    uVar17 = (pTVar11->vertices0).super_RawBufferView.stride;
    uVar5 = this->geomID_;
    uVar24 = (uint)(uVar17 >> 2) & 0x3fffffff;
    aVar25.m128[2] = -INFINITY;
    aVar25._0_8_ = 0xff800000ff800000;
    aVar25.m128[3] = -INFINITY;
    aVar26.m128[2] = INFINITY;
    aVar26._0_8_ = 0x7f8000007f800000;
    aVar26.m128[3] = INFINITY;
    lVar22 = 0;
    do {
      uVar6 = *(uint *)((long)&pBVar12[uVar4].field_0 + lVar22 * 2 + 4);
      lVar23 = (ulong)uVar6 * lVar14;
      uVar7 = *(uint *)(lVar13 + lVar23);
      uVar8 = *(uint *)(lVar13 + 4 + lVar23);
      uVar9 = *(uint *)(lVar13 + 8 + lVar23);
      auVar3 = vminps_avx((undefined1  [16])aVar26,*(undefined1 (*) [16])(pcVar15 + uVar7 * uVar17))
      ;
      auVar16 = vminps_avx(*(undefined1 (*) [16])(pcVar15 + uVar8 * uVar17),
                           *(undefined1 (*) [16])(pcVar15 + uVar9 * uVar17));
      aVar26 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vminps_avx(auVar3,auVar16);
      auVar3 = vmaxps_avx((undefined1  [16])aVar25,*(undefined1 (*) [16])(pcVar15 + uVar7 * uVar17))
      ;
      auVar16 = vmaxps_avx(*(undefined1 (*) [16])(pcVar15 + uVar8 * uVar17),
                           *(undefined1 (*) [16])(pcVar15 + uVar9 * uVar17));
      aVar25 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vmaxps_avx(auVar3,auVar16);
      *(uint *)(local_b8 + lVar22) = uVar5;
      *(uint *)(local_78 + lVar22) = uVar6;
      *(uint *)(local_c8 + lVar22) = uVar24 * uVar7;
      *(uint *)(local_a8 + lVar22) = uVar8 * uVar24;
      *(uint *)(local_88 + lVar22) = uVar9 * uVar24;
      lVar22 = lVar22 + 4;
      local_58 = aVar26;
      local_48 = aVar25;
    } while ((uVar19 + (uVar19 == 0)) * 4 != lVar22);
  }
  if (uVar20 - uVar4 < 4) {
    __n = uVar19 * -4 + 0x10;
    memset(local_78 + uVar19 * 4,0xff,__n);
    memset(local_c8 + uVar19 * 4,0,__n);
    memset(local_a8 + uVar19 * 4,0,__n);
    memset(local_88 + uVar19 * 4,0,__n);
    do {
      *(undefined4 *)(local_b8 + uVar19 * 4) = local_b8._0_4_;
      uVar19 = uVar19 + 1;
    } while (uVar19 != 4);
  }
  auVar3 = vmovntps_avx(local_c8);
  *local_60 = auVar3;
  auVar3 = vmovntps_avx(local_a8);
  local_60[1] = auVar3;
  auVar3 = vmovntps_avx(local_88);
  local_60[2] = auVar3;
  auVar3 = vmovntps_avx(local_b8);
  local_60[3] = auVar3;
  auVar3 = vmovntps_avx(local_78);
  local_60[4] = auVar3;
  (local_90->ref).ptr = (ulong)local_60 | 9;
  (local_90->bounds).lower.field_0 = local_58;
  (local_90->bounds).upper.field_0 = local_48;
  return local_90;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4i* accel = (Triangle4i*) alloc.malloc1(sizeof(Triangle4i),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);
        
        vuint4 v0 = zero, v1 = zero, v2 = zero;
        vuint4 vgeomID = -1, vprimID = -1;
        const TriangleMesh* __restrict__ const mesh = this->mesh;
        
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID[i] = geomID_;
          vprimID[i] = primID;
          unsigned int int_stride = mesh->vertices0.getStride()/4;
          v0[i] = tri.v[0] * int_stride; 
          v1[i] = tri.v[1] * int_stride;
          v2[i] = tri.v[2] * int_stride;
        }
        
        for (size_t i=items; i<4; i++)
        {
          vgeomID[i] = vgeomID[0];
          vprimID[i] = -1;
          v0[i] = 0;
          v1[i] = 0; 
          v2[i] = 0;
        }
        Triangle4i::store_nt(accel,Triangle4i(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }